

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O0

LogicalType * __thiscall
duckdb::CatalogEntryRetriever::GetType
          (CatalogEntryRetriever *this,string *catalog,string *schema,string *name,
          OnEntryNotFound on_entry_not_found)

{
  bool bVar1;
  string *in_RSI;
  CatalogEntry *in_RDI;
  optional_idx in_R8;
  TypeCatalogEntry *type_entry;
  optional_ptr<duckdb::CatalogEntry,_true> result;
  EntryLookupInfo lookup_info;
  string *in_stack_ffffffffffffff68;
  CatalogEntry *this_00;
  LogicalTypeId id;
  string *in_stack_ffffffffffffff90;
  CatalogEntryRetriever *in_stack_ffffffffffffff98;
  optional_idx local_60;
  QueryErrorContext local_58 [11];
  
  this_00 = in_RDI;
  optional_idx::optional_idx(&local_60);
  QueryErrorContext::QueryErrorContext(local_58,local_60);
  EntryLookupInfo::EntryLookupInfo
            ((EntryLookupInfo *)this_00,(CatalogType)((ulong)in_RDI >> 0x38),
             in_stack_ffffffffffffff68,(QueryErrorContext)in_R8.index);
  GetEntry(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RSI,(EntryLookupInfo *)in_R8.index
           ,(OnEntryNotFound)((ulong)this_00 >> 0x38));
  id = (LogicalTypeId)((ulong)in_RSI >> 0x38);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0xffffffffffffff98);
  if (bVar1) {
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)in_RDI);
    CatalogEntry::Cast<duckdb::TypeCatalogEntry>(in_RDI);
    LogicalType::LogicalType((LogicalType *)in_RDI,(LogicalType *)in_stack_ffffffffffffff68);
  }
  else {
    LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffff90,id);
  }
  return (LogicalType *)this_00;
}

Assistant:

LogicalType CatalogEntryRetriever::GetType(const string &catalog, const string &schema, const string &name,
                                           OnEntryNotFound on_entry_not_found) {
	EntryLookupInfo lookup_info(CatalogType::TYPE_ENTRY, name);
	auto result = GetEntry(catalog, schema, lookup_info, on_entry_not_found);
	if (!result) {
		return LogicalType::INVALID;
	}
	auto &type_entry = result->Cast<TypeCatalogEntry>();
	return type_entry.user_type;
}